

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O0

void __thiscall wabt::Features::EnableAll(Features *this)

{
  Features *this_local;
  
  enable_exceptions(this);
  enable_mutable_globals(this);
  enable_sat_float_to_int(this);
  enable_sign_extension(this);
  enable_simd(this);
  enable_threads(this);
  enable_function_references(this);
  enable_multi_value(this);
  enable_tail_call(this);
  enable_bulk_memory(this);
  enable_reference_types(this);
  enable_annotations(this);
  enable_code_metadata(this);
  enable_gc(this);
  enable_memory64(this);
  enable_multi_memory(this);
  enable_extended_const(this);
  enable_relaxed_simd(this);
  enable_custom_page_sizes(this);
  return;
}

Assistant:

void EnableAll() {
#define WABT_FEATURE(variable, flag, default_, help) enable_##variable();
#include "wabt/feature.def"
#undef WABT_FEATURE
  }